

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

void update_node_encoding(adh_node_t *node)

{
  byte_t bVar1;
  bit_array_t *pbVar2;
  adh_node *local_20;
  adh_node_t *parent;
  bit_array_t *bit_array;
  adh_node_t *node_local;
  
  if (node != (adh_node_t *)0x0) {
    update_node_encoding(node->left);
    update_node_encoding(node->right);
    pbVar2 = &node->bit_array;
    pbVar2->length = 0;
    bit_array = (bit_array_t *)node;
    for (local_20 = node->parent; local_20 != (adh_node *)0x0; local_20 = local_20->parent) {
      if (pbVar2->length == 0x100) {
        log_error("update_node_encoding","bit_array->length == MAX_CODE_BITS");
        exit(1);
      }
      bVar1 = '0';
      if (local_20->right == (adh_node *)bit_array) {
        bVar1 = '1';
      }
      (node->bit_array).buffer[pbVar2->length] = bVar1;
      pbVar2->length = pbVar2->length + 1;
      bit_array = (bit_array_t *)local_20;
    }
  }
  return;
}

Assistant:

void update_node_encoding(adh_node_t *node) {
    if(node != NULL) {
        update_node_encoding(node->left);
        update_node_encoding(node->right);

        bit_array_t* bit_array = &(node->bit_array);
        bit_array->length = 0;

        adh_node_t * parent = node->parent;
        while(parent != NULL) {
            if(bit_array->length == MAX_CODE_BITS) {
                log_error("update_node_encoding", "bit_array->length == MAX_CODE_BITS");

                //TODO: exit properly, need to release resources
                exit(1);
            }

            // 0 = left node, 1 = right node
            bit_array->buffer[bit_array->length] = (parent->right == node) ? BIT_1 : BIT_0;
            bit_array->length++;

            node = parent;
            parent = node->parent;
        }

#ifdef _DEBUG
        log_trace("  update_node_encoding", "%s bin=%s\n",
                fmt_node(node),
                fmt_bit_array(bit_array));
#endif

    }
}